

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeUEF.cpp
# Opt level: O2

void __thiscall Storage::Tape::UEF::queue_implicit_byte(UEF *this,uint8_t byte)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = (ulong)byte;
  queue_bit(this,0);
  for (iVar2 = -8; iVar2 != 0; iVar2 = iVar2 + 1) {
    queue_bit(this,(uint)((byte)uVar1 & 1));
    uVar1 = uVar1 >> 1;
  }
  queue_bit(this,1);
  return;
}

Assistant:

void UEF::queue_implicit_byte(uint8_t byte) {
	queue_bit(0);
	int c = 8;
	while(c--) {
		queue_bit(byte&1);
		byte >>= 1;
	}
	queue_bit(1);
}